

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O2

void send_tree(deflate_state *s,ct_data *tree,int max_code)

{
  Bytef BVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ulg uVar5;
  int iVar6;
  int iVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ushort uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  
  uVar2 = (tree->dl).dad;
  uVar11 = (uint)uVar2;
  uVar17 = 7;
  if (uVar2 == 0) {
    uVar17 = 0x8a;
  }
  iVar9 = (uVar2 != 0) + 3;
  lVar12 = 0;
  uVar16 = 0xffffffff;
  do {
    uVar14 = 0xffffffff;
    iVar6 = -1;
    do {
      iVar7 = iVar6;
      uVar10 = uVar11;
      uVar15 = uVar14;
      if (max_code < lVar12) {
        return;
      }
      uVar2 = tree[lVar12 + 1].dl.dad;
      uVar11 = (uint)uVar2;
      lVar12 = lVar12 + 1;
      uVar14 = uVar15 + 1;
    } while (((int)(uVar15 + 2) < (int)uVar17) && (iVar6 = iVar7 + -1, uVar10 == uVar11));
    uVar17 = uVar15 + 2;
    if ((int)uVar17 < iVar9) {
      iVar9 = s->bi_valid;
      do {
        uVar3 = s->bl_tree[uVar10].dl.dad;
        uVar4 = s->bl_tree[uVar10].fc.freq;
        uVar13 = uVar4 << ((byte)iVar9 & 0x1f) | s->bi_buf;
        s->bi_buf = uVar13;
        if ((int)(0x10 - (uint)uVar3) < iVar9) {
          uVar5 = s->pending;
          s->pending = uVar5 + 1;
          s->pending_buf[uVar5] = (Bytef)uVar13;
          BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
          uVar5 = s->pending;
          s->pending = uVar5 + 1;
          s->pending_buf[uVar5] = BVar1;
          s->bi_buf = uVar4 >> (0x10U - (char)s->bi_valid & 0x1f);
          iVar9 = (uint)uVar3 + s->bi_valid + -0x10;
        }
        else {
          iVar9 = iVar9 + (uint)uVar3;
        }
        s->bi_valid = iVar9;
        iVar7 = iVar7 + 1;
      } while (iVar7 != 0);
    }
    else {
      iVar9 = s->bi_valid;
      bVar8 = (byte)iVar9;
      if (uVar10 == 0) {
        if (uVar14 < 10) {
          uVar3 = s->bl_tree[0x11].dl.dad;
          uVar4 = s->bl_tree[0x11].fc.freq;
          uVar17 = (uint)s->bi_buf | (uint)uVar4 << (bVar8 & 0x1f);
          if ((int)(0x10 - (uint)uVar3) < iVar9) {
            s->bi_buf = (ush)uVar17;
            uVar5 = s->pending;
            s->pending = uVar5 + 1;
            s->pending_buf[uVar5] = (Bytef)uVar17;
            BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
            uVar5 = s->pending;
            s->pending = uVar5 + 1;
            s->pending_buf[uVar5] = BVar1;
            iVar9 = s->bi_valid + (uint)uVar3 + -0x10;
            uVar17 = (uint)(uVar4 >> (0x10U - (char)s->bi_valid & 0x1f));
          }
          else {
            iVar9 = iVar9 + (uint)uVar3;
          }
          s->bi_valid = iVar9;
          uVar15 = uVar15 + 0xffff;
          if (iVar9 < 0xe) {
            s->bi_buf = (ushort)uVar17 | (ushort)(uVar15 << ((byte)iVar9 & 0x1f));
            iVar9 = iVar9 + 3;
          }
          else {
            uVar17 = uVar17 | uVar15 << ((byte)iVar9 & 0x1f);
            s->bi_buf = (ush)uVar17;
            uVar5 = s->pending;
            s->pending = uVar5 + 1;
            s->pending_buf[uVar5] = (Bytef)uVar17;
            BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
            uVar5 = s->pending;
            s->pending = uVar5 + 1;
            s->pending_buf[uVar5] = BVar1;
            s->bi_buf = (ush)((uVar15 & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
            iVar9 = s->bi_valid + -0xd;
          }
        }
        else {
          uVar3 = s->bl_tree[0x12].dl.dad;
          uVar4 = s->bl_tree[0x12].fc.freq;
          uVar17 = (uint)s->bi_buf | (uint)uVar4 << (bVar8 & 0x1f);
          if ((int)(0x10 - (uint)uVar3) < iVar9) {
            s->bi_buf = (ush)uVar17;
            uVar5 = s->pending;
            s->pending = uVar5 + 1;
            s->pending_buf[uVar5] = (Bytef)uVar17;
            BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
            uVar5 = s->pending;
            s->pending = uVar5 + 1;
            s->pending_buf[uVar5] = BVar1;
            iVar9 = s->bi_valid + (uint)uVar3 + -0x10;
            uVar17 = (uint)(uVar4 >> (0x10U - (char)s->bi_valid & 0x1f));
          }
          else {
            iVar9 = iVar9 + (uint)uVar3;
          }
          s->bi_valid = iVar9;
          uVar15 = uVar15 + 0xfff7;
          if (iVar9 < 10) {
            s->bi_buf = (ushort)uVar17 | (ushort)(uVar15 << ((byte)iVar9 & 0x1f));
            iVar9 = iVar9 + 7;
          }
          else {
            uVar17 = uVar17 | uVar15 << ((byte)iVar9 & 0x1f);
            s->bi_buf = (ush)uVar17;
            uVar5 = s->pending;
            s->pending = uVar5 + 1;
            s->pending_buf[uVar5] = (Bytef)uVar17;
            BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
            uVar5 = s->pending;
            s->pending = uVar5 + 1;
            s->pending_buf[uVar5] = BVar1;
            s->bi_buf = (ush)((uVar15 & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
            iVar9 = s->bi_valid + -9;
          }
        }
      }
      else {
        if (uVar10 != uVar16) {
          uVar3 = s->bl_tree[uVar10].dl.dad;
          uVar4 = s->bl_tree[uVar10].fc.freq;
          uVar13 = uVar4 << (bVar8 & 0x1f) | s->bi_buf;
          s->bi_buf = uVar13;
          if ((int)(0x10 - (uint)uVar3) < iVar9) {
            uVar5 = s->pending;
            s->pending = uVar5 + 1;
            s->pending_buf[uVar5] = (Bytef)uVar13;
            BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
            uVar5 = s->pending;
            s->pending = uVar5 + 1;
            s->pending_buf[uVar5] = BVar1;
            s->bi_buf = uVar4 >> (0x10U - (char)s->bi_valid & 0x1f);
            iVar9 = s->bi_valid + (uint)uVar3 + -0x10;
          }
          else {
            iVar9 = iVar9 + (uint)uVar3;
          }
          s->bi_valid = iVar9;
          uVar17 = uVar14;
        }
        uVar3 = s->bl_tree[0x10].dl.dad;
        uVar4 = s->bl_tree[0x10].fc.freq;
        uVar13 = uVar4 << ((byte)iVar9 & 0x1f) | s->bi_buf;
        if ((int)(0x10 - (uint)uVar3) < iVar9) {
          s->bi_buf = uVar13;
          uVar5 = s->pending;
          s->pending = uVar5 + 1;
          s->pending_buf[uVar5] = (Bytef)uVar13;
          BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
          uVar5 = s->pending;
          s->pending = uVar5 + 1;
          s->pending_buf[uVar5] = BVar1;
          uVar13 = uVar4 >> (0x10U - (char)s->bi_valid & 0x1f);
          iVar9 = s->bi_valid + (uint)uVar3 + -0x10;
        }
        else {
          iVar9 = iVar9 + (uint)uVar3;
        }
        s->bi_valid = iVar9;
        uVar17 = uVar17 + 0xfffd;
        if (iVar9 < 0xf) {
          s->bi_buf = uVar13 | (ushort)(uVar17 << ((byte)iVar9 & 0x1f));
          iVar9 = iVar9 + 2;
        }
        else {
          uVar16 = (uint)uVar13 | uVar17 << ((byte)iVar9 & 0x1f);
          s->bi_buf = (ush)uVar16;
          uVar5 = s->pending;
          s->pending = uVar5 + 1;
          s->pending_buf[uVar5] = (Bytef)uVar16;
          BVar1 = *(Bytef *)((long)&s->bi_buf + 1);
          uVar5 = s->pending;
          s->pending = uVar5 + 1;
          s->pending_buf[uVar5] = BVar1;
          s->bi_buf = (ush)((uVar17 & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
          iVar9 = s->bi_valid + -0xe;
        }
      }
      s->bi_valid = iVar9;
    }
    iVar9 = 4 - (uint)(uVar10 == uVar11);
    uVar17 = uVar10 == uVar11 ^ 7;
    uVar16 = uVar10;
    if (uVar2 == 0) {
      iVar9 = 3;
      uVar17 = 0x8a;
    }
  } while( true );
}

Assistant:

local void send_tree (s, tree, max_code)
    deflate_state *s;
    ct_data *tree; /* the tree to be scanned */
    int max_code;       /* and its largest code of non zero frequency */
{
    int n;                     /* iterates over all tree elements */
    int prevlen = -1;          /* last emitted length */
    int curlen;                /* length of current code */
    int nextlen = tree[0].Len; /* length of next code */
    int count = 0;             /* repeat count of the current code */
    int max_count = 7;         /* max repeat count */
    int min_count = 4;         /* min repeat count */

    /* tree[max_code+1].Len = -1; */  /* guard already set */
    if (nextlen == 0) max_count = 138, min_count = 3;

    for (n = 0; n <= max_code; n++) {
        curlen = nextlen; nextlen = tree[n+1].Len;
        if (++count < max_count && curlen == nextlen) {
            continue;
        } else if (count < min_count) {
            do { send_code(s, curlen, s->bl_tree); } while (--count != 0);

        } else if (curlen != 0) {
            if (curlen != prevlen) {
                send_code(s, curlen, s->bl_tree); count--;
            }
            Assert(count >= 3 && count <= 6, " 3_6?");
            send_code(s, REP_3_6, s->bl_tree); send_bits(s, count-3, 2);

        } else if (count <= 10) {
            send_code(s, REPZ_3_10, s->bl_tree); send_bits(s, count-3, 3);

        } else {
            send_code(s, REPZ_11_138, s->bl_tree); send_bits(s, count-11, 7);
        }
        count = 0; prevlen = curlen;
        if (nextlen == 0) {
            max_count = 138, min_count = 3;
        } else if (curlen == nextlen) {
            max_count = 6, min_count = 3;
        } else {
            max_count = 7, min_count = 4;
        }
    }
}